

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O0

void __thiscall
PA5Application::RenderObject::setProgramMaterial
          (RenderObject *this,shared_ptr<Program> *program,SimpleMaterial *material)

{
  element_type *peVar1;
  pointer pSVar2;
  vec<3,_float,_(glm::qualifier)0> vVar3;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  vec<3,_float,_(glm::qualifier)0> local_1b0;
  allocator<char> local_1a1;
  string local_1a0;
  undefined8 local_180;
  float local_178;
  vec<3,_float,_(glm::qualifier)0> local_16c;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_160;
  allocator<char> local_151;
  string local_150;
  vec<3,_float,_(glm::qualifier)0> local_130;
  allocator<char> local_121;
  string local_120;
  undefined8 local_100;
  float local_f8;
  vec<3,_float,_(glm::qualifier)0> local_ec;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_e0;
  allocator<char> local_d1;
  string local_d0;
  vec<3,_float,_(glm::qualifier)0> local_b0;
  allocator<char> local_a1;
  string local_a0;
  undefined8 local_80;
  float local_78;
  vec<3,_float,_(glm::qualifier)0> local_6c;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_60 [2];
  allocator<char> local_41;
  string local_40;
  SimpleMaterial *local_20;
  SimpleMaterial *material_local;
  shared_ptr<Program> *program_local;
  RenderObject *this_local;
  
  local_20 = material;
  material_local = (SimpleMaterial *)program;
  program_local = (shared_ptr<Program> *)this;
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      program);
  (**(peVar1->super_OGLStateObject)._vptr_OGLStateObject)();
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"lightsInWorld[0].direction",&local_41);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_6c,0,-1,1);
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_6c);
  local_78 = vVar3.field_0._8_4_;
  local_80 = vVar3.field_0._0_8_;
  local_60[0]._0_8_ = local_80;
  local_60[0]._8_4_ = local_78;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (peVar1,&local_40,(vec<3,_float,_(glm::qualifier)0> *)&local_60[0].field_0);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"lightsInWorld[0].intensity",&local_a1);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_b0,0.7,0.7,0.7);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(peVar1,&local_a0,&local_b0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"lightsInWorld[1].direction",&local_d1);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_ec,0,1,0.5);
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_ec);
  local_f8 = vVar3.field_0._8_4_;
  local_100 = vVar3.field_0._0_8_;
  local_e0._0_8_ = local_100;
  local_e0.field_0.z = local_f8;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (peVar1,&local_d0,(vec<3,_float,_(glm::qualifier)0> *)&local_e0.field_0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"lightsInWorld[1].intensity",&local_121);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_130,0.5,0.5,0.5);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(peVar1,&local_120,&local_130);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"lightsInWorld[2].direction",&local_151);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_16c,-1,0,1);
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_16c);
  local_178 = vVar3.field_0._8_4_;
  local_180 = vVar3.field_0._0_8_;
  local_160._0_8_ = local_180;
  local_160.field_0.z = local_178;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (peVar1,&local_150,(vec<3,_float,_(glm::qualifier)0> *)&local_160.field_0);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"lightsInWorld[2].intensity",&local_1a1);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_1b0,0.6,0.6,0.6);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(peVar1,&local_1a0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"material.ambient",&local_1d1);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(peVar1,&local_1d0,&local_20->ambient);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"material.diffuse",&local_1f9);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(peVar1,&local_1f8,&local_20->diffuse);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"material.specular",&local_221);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(peVar1,&local_220,&local_20->specular);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"material.shininess",&local_249);
  Program::setUniform<float>(peVar1,&local_248,&local_20->shininess);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  pSVar2 = std::unique_ptr<Sampler,_std::default_delete<Sampler>_>::operator->(&this->m_diffusemap);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"material.colormap",&local_271);
  Sampler::attachToProgram(pSVar2,peVar1,&local_270,DoNotBind);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  pSVar2 = std::unique_ptr<Sampler,_std::default_delete<Sampler>_>::operator->(&this->m_normalmap);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"material.normalmap",&local_299);
  Sampler::attachToProgram(pSVar2,peVar1,&local_298,DoNotBind);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pSVar2 = std::unique_ptr<Sampler,_std::default_delete<Sampler>_>::operator->(&this->m_specularmap)
  ;
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"material.specularmap",&local_2c1);
  Sampler::attachToProgram(pSVar2,peVar1,&local_2c0,DoNotBind);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      material_local);
  (*(peVar1->super_OGLStateObject)._vptr_OGLStateObject[1])();
  return;
}

Assistant:

void PA5Application::RenderObject::setProgramMaterial(std::shared_ptr<Program> & program, const SimpleMaterial & material) const
{
  program->bind();
  program->setUniform("lightsInWorld[0].direction", glm::normalize(glm::vec3(0, -1, 1)));
  program->setUniform("lightsInWorld[0].intensity", glm::vec3(0.7, 0.7, 0.7));
  program->setUniform("lightsInWorld[1].direction", glm::normalize(glm::vec3(0, 1, 0.5)));
  program->setUniform("lightsInWorld[1].intensity", glm::vec3(0.5, 0.5, 0.5));
  program->setUniform("lightsInWorld[2].direction", glm::normalize(glm::vec3(-1, 0, 1)));
  program->setUniform("lightsInWorld[2].intensity", glm::vec3(0.6, 0.6, 0.6));
  program->setUniform("material.ambient", material.ambient);
  program->setUniform("material.diffuse", material.diffuse);
  program->setUniform("material.specular", material.specular);
  program->setUniform("material.shininess", material.shininess);
  m_diffusemap->attachToProgram(*program, "material.colormap", Sampler::DoNotBind);
  m_normalmap->attachToProgram(*program, "material.normalmap", Sampler::DoNotBind);
  m_specularmap->attachToProgram(*program, "material.specularmap", Sampler::DoNotBind);
  program->unbind();
}